

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wf.h
# Opt level: O2

void __thiscall trieste::wf::Fields::gen(Fields *this,Gen *g,size_t depth,Node *node)

{
  pointer pFVar1;
  NodeDef *this_00;
  socklen_t __len;
  sockaddr *__addr;
  pointer pFVar3;
  __shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> local_40;
  __shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> *p_Var2;
  
  pFVar1 = (this->fields).
           super__Vector_base<trieste::wf::Field,_std::allocator<trieste::wf::Field>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pFVar3 = (this->fields).
                super__Vector_base<trieste::wf::Field,_std::allocator<trieste::wf::Field>_>._M_impl.
                super__Vector_impl_data._M_start; pFVar3 != pFVar1; pFVar3 = pFVar3 + 1) {
    std::__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_40,&node->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>);
    p_Var2 = &local_40;
    Choice::gen(&pFVar3->choice,g,depth,(Node *)&local_40);
    __len = (socklen_t)p_Var2;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
    if ((this->binding).def == (pFVar3->name).def) {
      this_00 = (node->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      NodeDef::bind(this_00,(int)(this_00->children).
                                 super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish[-1].
                                 super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr + 0x18,__addr,__len);
    }
  }
  return;
}

Assistant:

void gen(Gen& g, size_t depth, Node node) const
      {
        for (auto& field : fields)
        {
          field.choice.gen(g, depth, node);

          if (binding == field.name)
            node->bind(node->back()->location());
        }
      }